

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O2

int Abc_SclCountBufferFanoutsInt(Abc_Obj_t *pObj)

{
  Abc_Obj_t *pObj_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar2 = (pObj->vFanouts).nSize;
  uVar5 = 0;
  uVar4 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar4 = uVar5;
  }
  iVar3 = 0;
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    pObj_00 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[uVar5]];
    if (((*(uint *)&pObj_00->field_0x14 & 0xf) == 7) && ((pObj_00->vFanins).nSize == 1)) {
      iVar1 = Abc_SclCountBufferFanoutsInt(pObj_00);
      iVar3 = iVar3 + iVar1;
    }
  }
  uVar2 = 0;
  if ((*(uint *)&pObj->field_0x14 & 0xf) == 7) {
    uVar2 = (uint)((pObj->vFanins).nSize == 1);
  }
  return uVar2 + iVar3;
}

Assistant:

int Abc_SclCountBufferFanoutsInt( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    int i, Counter = 0;
    Abc_ObjForEachFanout( pObj, pFanout, i )
        if ( Abc_ObjIsBuffer(pFanout) )
            Counter += Abc_SclCountBufferFanoutsInt( pFanout );
    return Counter + Abc_ObjIsBuffer(pObj);
}